

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O3

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer
          (PredicateSplitPassiveClauseContainer *this,bool isOutermost,Options *opt,string *name,
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          *queues,vector<float,_std::allocator<float>_> *cutoffs,
          vector<int,_std::allocator<int>_> *ratios,bool layeredArrangement)

{
  vector<float,_std::allocator<float>_> *this_00;
  bool bVar1;
  uint uVar2;
  pointer pcVar3;
  iterator iVar4;
  pointer puVar5;
  int a;
  undefined8 *puVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  pointer piVar10;
  ulong uVar11;
  ulong uVar12;
  pointer piVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 local_168;
  unsigned_long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  unsigned_long local_140;
  long local_138;
  long lStack_130;
  string *local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<float,_std::allocator<float>_> *local_f8;
  string local_f0;
  string local_d0;
  char local_b0 [32];
  string local_90;
  long local_70;
  long local_68;
  long local_50;
  long local_48;
  
  pcVar3 = (name->_M_dataplus)._M_p;
  local_128 = name;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
  PassiveClauseContainer::PassiveClauseContainer
            (&this->super_PassiveClauseContainer,isOutermost,opt,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
  _vptr_ClauseContainer = (_func_int **)&PTR__PredicateSplitPassiveClauseContainer_00b3f3b8;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->_ratios;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (queues->
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar5;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->_cutoffs;
  std::vector<float,_std::allocator<float>_>::vector(this_00,cutoffs);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &this->_invertedRatios;
  local_120 = &this->_balances;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_layeredArrangement = layeredArrangement;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (bool)(opt->_randomAWR).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92;
  this->_randomize = bVar1;
  piVar10 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar13 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  uVar11 = (long)piVar13 - (long)piVar10 >> 2;
  local_f8 = this_00;
  if (uVar11 == (long)(this->_queues).
                      super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_queues).
                      super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) {
    if ((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == (long)piVar13 - (long)piVar10) {
      if ((bVar1 != false) && (this->_ratioSum = 0, piVar13 != piVar10)) {
        uVar12 = 0;
        uVar9 = 1;
        do {
          uVar2 = piVar10[uVar12];
          local_168 = (long *)CONCAT44(local_168._4_4_,uVar2);
          this->_ratioSum = this->_ratioSum + uVar2;
          iVar4._M_current =
               (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)__rhs,iVar4,
                       (uint *)&local_168);
            piVar10 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar13 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            *iVar4._M_current = uVar2;
            (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          uVar11 = (long)piVar13 - (long)piVar10 >> 2;
          bVar1 = uVar9 < uVar11;
          uVar12 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar1);
      }
      if (piVar13 != piVar10) {
        a = 1;
        uVar12 = 0;
        do {
          a = computeLCM(a,piVar10[uVar12]);
          uVar12 = uVar12 + 1;
        } while ((uVar12 & 0xffffffff) < uVar11);
        if (piVar13 != piVar10) {
          uVar11 = 0;
          uVar12 = 1;
          do {
            iVar4._M_current =
                 (this->_invertedRatios).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->_invertedRatios).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_168._0_4_ = a / piVar10[uVar11];
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__lhs,iVar4,
                         (uint *)&local_168);
            }
            else {
              *iVar4._M_current = a / piVar10[uVar11];
              (this->_invertedRatios).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            local_168 = (long *)((ulong)local_168._4_4_ << 0x20);
            iVar4._M_current =
                 (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_120,iVar4,(uint *)&local_168);
            }
            else {
              *iVar4._M_current = 0;
              (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            piVar10 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            bVar1 = uVar12 < (ulong)((long)(ratios->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar10
                                    >> 2);
            uVar11 = uVar12;
            uVar12 = (ulong)((int)uVar12 + 1);
          } while (bVar1);
        }
      }
      return;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(&local_118,"Queue ",local_128);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_148 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_148 == plVar8) {
      local_138 = *plVar8;
      lStack_130 = plVar7[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar8;
    }
    local_140 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Lib::Int::toString_abi_cxx11_
              (&local_d0,
               (Int *)((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2),local_140);
    std::operator+(__lhs,__rhs);
    plVar7 = (long *)std::__cxx11::string::append(local_b0);
    local_168 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_168 == plVar8) {
      local_158 = *plVar8;
      lStack_150 = plVar7[3];
      local_168 = &local_158;
    }
    else {
      local_158 = *plVar8;
    }
    local_160 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Lib::Int::toString_abi_cxx11_
              (&local_f0,
               (Int *)((long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3),local_160);
    std::operator+(__lhs,__rhs);
    *puVar6 = &PTR_cry_00b3dfc0;
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_70,local_68 + local_70);
    *puVar6 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar6 + 5) = 0;
    puVar6[6] = puVar6 + 8;
    puVar6[7] = 0;
    *(undefined1 *)(puVar6 + 8) = 0;
    __cxa_throw(puVar6,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x50);
  std::operator+(&local_118,"Queue ",local_128);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_148 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_148 == plVar8) {
    local_138 = *plVar8;
    lStack_130 = plVar7[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *plVar8;
  }
  local_140 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Lib::Int::toString_abi_cxx11_
            (&local_d0,
             (Int *)((long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2),local_140);
  std::operator+(__lhs,__rhs);
  plVar7 = (long *)std::__cxx11::string::append(local_b0);
  local_168 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_168 == plVar8) {
    local_158 = *plVar8;
    lStack_150 = plVar7[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *plVar8;
  }
  local_160 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Lib::Int::toString_abi_cxx11_
            (&local_f0,
             (Int *)((long)(this->_queues).
                           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_queues).
                           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3),local_160);
  std::operator+(__lhs,__rhs);
  *puVar6 = &PTR_cry_00b3dfc0;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_50,local_48 + local_50);
  *puVar6 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar6 + 5) = 0;
  puVar6[6] = puVar6 + 8;
  puVar6[7] = 0;
  *(undefined1 *)(puVar6 + 8) = 0;
  __cxa_throw(puVar6,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer(bool isOutermost, const Shell::Options& opt, std::string name,
    std::vector<std::unique_ptr<PassiveClauseContainer>> queues,
    std::vector<float> cutoffs, std::vector<int> ratios, bool layeredArrangement)
  : PassiveClauseContainer(isOutermost, opt, name), _queues(std::move(queues)), _cutoffs(cutoffs), _layeredArrangement(layeredArrangement)
{
  _randomize = opt.randomAWR();

  // sanity checks
  if (ratios.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of ratios needs to match the number of queues, but " + Int::toString(ratios.size()) + " != " + Int::toString(_queues.size()));
  }
  if (_cutoffs.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of cutoffs needs to match the number of queues, but " + Int::toString(_cutoffs.size()) + " != " + Int::toString(_queues.size()));
  }

  if (_randomize) {
    _ratioSum = 0;
    for (unsigned i = 0; i < ratios.size(); i++) {
      unsigned ri = ratios[i];
      _ratioSum += ri;
      _ratios.push_back(ri);
    }
  }

  // even when randomizing true selection, we rely on the old ways for simulation:

  // compute lcm, which will be used to compute reverse ratios
  auto lcm = 1;
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    lcm = computeLCM(lcm, ratios[i]);
  }
  // initialize
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    _invertedRatios.push_back(lcm / ratios[i]);
    _balances.push_back(0);
  }
}